

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3WhereAddLimit(WhereClause *pWC,Select *p)

{
  int iVar1;
  int *piVar2;
  long in_RSI;
  long in_RDI;
  Expr *pExpr;
  int ii;
  int iCsr;
  ExprList *pOrderBy;
  int local_20;
  
  if ((((*(long *)(in_RSI + 0x38) == 0) && ((*(uint *)(in_RSI + 4) & 9) == 0)) &&
      (**(int **)(in_RSI + 0x28) == 1)) &&
     (*(char *)(*(long *)(*(long *)(in_RSI + 0x28) + 0x18) + 0x3f) == '\x01')) {
    piVar2 = *(int **)(in_RSI + 0x48);
    iVar1 = *(int *)(*(long *)(in_RSI + 0x28) + 0x24);
    for (local_20 = 0; local_20 < *(int *)(in_RDI + 0x14); local_20 = local_20 + 1) {
      if (((*(ushort *)(*(long *)(in_RDI + 0x20) + (long)local_20 * 0x38 + 0x12) & 4) == 0) &&
         (*(char *)(*(long *)(in_RDI + 0x20) + (long)local_20 * 0x38 + 0x16) == '\0')) {
        if (*(int *)(*(long *)(in_RDI + 0x20) + (long)local_20 * 0x38 + 0x1c) != iVar1) {
          return;
        }
        if (*(long *)(*(long *)(in_RDI + 0x20) + (long)local_20 * 0x38 + 0x28) != 0) {
          return;
        }
      }
    }
    if (piVar2 != (int *)0x0) {
      for (local_20 = 0; local_20 < *piVar2; local_20 = local_20 + 1) {
        if (**(char **)(piVar2 + (long)local_20 * 6 + 2) != -0x58) {
          return;
        }
        if (*(int *)(*(char **)(piVar2 + (long)local_20 * 6 + 2) + 0x2c) != iVar1) {
          return;
        }
        if ((*(byte *)(piVar2 + (long)local_20 * 6 + 6) & 2) != 0) {
          return;
        }
      }
    }
    if ((*(int *)(in_RSI + 0xc) != 0) && ((*(uint *)(in_RSI + 4) & 0x100) == 0)) {
      whereAddLimitExpr(pWC,p._4_4_,(Expr *)pOrderBy,iCsr,ii);
    }
    if ((*(int *)(in_RSI + 0xc) == 0) || ((*(uint *)(in_RSI + 4) & 0x100) == 0)) {
      whereAddLimitExpr(pWC,p._4_4_,(Expr *)pOrderBy,iCsr,ii);
    }
  }
  return;
}

Assistant:

SQLITE_NOINLINE sqlite3WhereAddLimit(WhereClause *pWC, Select *p){
  assert( p!=0 && p->pLimit!=0 );                 /* 1 -- checked by caller */
  if( p->pGroupBy==0
   && (p->selFlags & (SF_Distinct|SF_Aggregate))==0             /* 2 */
   && (p->pSrc->nSrc==1 && IsVirtual(p->pSrc->a[0].pSTab))      /* 3 */
  ){
    ExprList *pOrderBy = p->pOrderBy;
    int iCsr = p->pSrc->a[0].iCursor;
    int ii;

    /* Check condition (4). Return early if it is not met. */
    for(ii=0; ii<pWC->nTerm; ii++){
      if( pWC->a[ii].wtFlags & TERM_CODED ){
        /* This term is a vector operation that has been decomposed into
        ** other, subsequent terms.  It can be ignored. See tag-20220128a */
        assert( pWC->a[ii].wtFlags & TERM_VIRTUAL );
        assert( pWC->a[ii].eOperator==WO_ROWVAL );
        continue;
      }
      if( pWC->a[ii].nChild ){
        /* If this term has child terms, then they are also part of the
        ** pWC->a[] array. So this term can be ignored, as a LIMIT clause
        ** will only be added if each of the child terms passes the
        ** (leftCursor==iCsr) test below.  */
        continue;
      }
      if( pWC->a[ii].leftCursor!=iCsr ) return;
      if( pWC->a[ii].prereqRight!=0 ) return;
    }

    /* Check condition (5). Return early if it is not met. */
    if( pOrderBy ){
      for(ii=0; ii<pOrderBy->nExpr; ii++){
        Expr *pExpr = pOrderBy->a[ii].pExpr;
        if( pExpr->op!=TK_COLUMN ) return;
        if( pExpr->iTable!=iCsr ) return;
        if( pOrderBy->a[ii].fg.sortFlags & KEYINFO_ORDER_BIGNULL ) return;
      }
    }

    /* All conditions are met. Add the terms to the where-clause object. */
    assert( p->pLimit->op==TK_LIMIT );
    if( p->iOffset!=0 && (p->selFlags & SF_Compound)==0 ){
      whereAddLimitExpr(pWC, p->iOffset, p->pLimit->pRight,
                        iCsr, SQLITE_INDEX_CONSTRAINT_OFFSET);
    }
    if( p->iOffset==0 || (p->selFlags & SF_Compound)==0 ){
      whereAddLimitExpr(pWC, p->iLimit, p->pLimit->pLeft,
                        iCsr, SQLITE_INDEX_CONSTRAINT_LIMIT);
    }
  }
}